

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utf8Helper.h
# Opt level: O0

HRESULT utf8::
        NarrowStringToWide<Js::NarrowStringToWide(Js::Context*,char_const*,unsigned_long_const*,unsigned_int*)::__0>
                  (anon_class_8_1_ba1d3d87 allocator,LPCSTR sourceString,size_t sourceCount,
                  LPWSTR *destStringPtr,charcount_t *destCount,size_t *allocateCount)

{
  size_t size;
  char16 *destString_00;
  WCHAR *destString;
  size_t cbDestString;
  size_t *allocateCount_local;
  charcount_t *destCount_local;
  LPWSTR *destStringPtr_local;
  size_t sourceCount_local;
  LPCSTR sourceString_local;
  anon_class_8_1_ba1d3d87 allocator_local;
  
  size = (sourceCount + 1) * 2;
  if (size < sourceCount) {
    allocator_local.ctx._4_4_ = -0x7ff8fff2;
  }
  else {
    sourceString_local = (LPCSTR)allocator.ctx;
    destString_00 =
         Js::NarrowStringToWide::anon_class_8_1_ba1d3d87::operator()
                   ((anon_class_8_1_ba1d3d87 *)&sourceString_local,size);
    if (destString_00 == (char16 *)0x0) {
      allocator_local.ctx._4_4_ = -0x7ff8fff2;
    }
    else {
      if (allocateCount != (size_t *)0x0) {
        *allocateCount = size;
      }
      *destStringPtr = destString_00;
      allocator_local.ctx._4_4_ =
           NarrowStringToWideNoAlloc
                     (sourceString,sourceCount,destString_00,sourceCount + 1,destCount);
    }
  }
  return allocator_local.ctx._4_4_;
}

Assistant:

HRESULT NarrowStringToWide(_In_ AllocatorFunction allocator,_In_ LPCSTR sourceString,
        size_t sourceCount, _Out_ LPWSTR* destStringPtr, _Out_ charcount_t* destCount, size_t* allocateCount = nullptr)
    {
        size_t cbDestString = (sourceCount + 1) * sizeof(WCHAR);
        if (cbDestString < sourceCount) // overflow ?
        {
            return E_OUTOFMEMORY;
        }

        WCHAR* destString = (WCHAR*)allocator(cbDestString);
        if (destString == nullptr)
        {
            return E_OUTOFMEMORY;
        }

        if (allocateCount != nullptr)
        {
            *allocateCount = cbDestString;
        }

        *destStringPtr = destString;
        return NarrowStringToWideNoAlloc(sourceString, sourceCount, destString, sourceCount + 1, destCount);
    }